

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
* __thiscall
Kandinsky::Expression::derivatives
          (map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
           *__return_storage_ptr__,Expression *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Rb_tree_node_base *p_Var3;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  variableSet;
  undefined **local_a8;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_98;
  pair<Kandinsky::Variable,_Kandinsky::Expression> local_90;
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (**this->_vptr_Expression)(&local_60);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    peVar2 = (this->m_baseExpressionPtr).
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_BaseExpression[2])(&local_a8,peVar2,p_Var3 + 1);
    local_90.first._vptr_Variable = (_func_int **)&PTR_differentiate_0010ec38;
    local_90.first.m_variableExpressionPtr.
    super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)p_Var3[1]._M_parent;
    local_90.first.m_variableExpressionPtr.
    super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[1]._M_left;
    if ((_Base_ptr)
        local_90.first.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((_Base_ptr)
                 local_90.first.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)
                      local_90.first.m_variableExpressionPtr.
                      super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&((_Base_ptr)
                 local_90.first.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)
                      local_90.first.m_variableExpressionPtr.
                      super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_parent + 1;
      }
    }
    local_90.second._vptr_Expression = (_func_int **)&PTR_variables_0010ec60;
    local_90.second.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a0;
    local_90.second.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_98;
    local_a0 = (element_type *)0x0;
    p_Stack_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    _Rb_tree<Kandinsky::Variable,std::pair<Kandinsky::Variable_const,Kandinsky::Expression>,std::_Select1st<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>,Kandinsky::VariableLessThanComparator,std::allocator<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>>
    ::_M_emplace_unique<std::pair<Kandinsky::Variable,Kandinsky::Expression>>
              ((_Rb_tree<Kandinsky::Variable,std::pair<Kandinsky::Variable_const,Kandinsky::Expression>,std::_Select1st<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>,Kandinsky::VariableLessThanComparator,std::allocator<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>>
                *)__return_storage_ptr__,&local_90);
    local_90.second._vptr_Expression = (_func_int **)&PTR_variables_0010ec60;
    if (local_90.second.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.second.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_90.first._vptr_Variable = (_func_int **)&PTR_differentiate_0010ec38;
    if ((_Base_ptr)
        local_90.first.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.first.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_a8 = &PTR_variables_0010ec60;
    if (p_Stack_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_98);
    }
  }
  std::
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::map<Variable, Expression, VariableLessThanComparator> Expression::derivatives() const
    {
        std::map<Variable, Expression, VariableLessThanComparator> derivativeMap;
        std::set<Variable, VariableLessThanComparator> variableSet = variables();
        for (auto& variable : variableSet)
        {
            derivativeMap.insert(std::make_pair(variable, differentiate(variable)));
        }
        return derivativeMap;
    }